

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<double,_3,_3> * __thiscall
math::Matrix<double,_3,_3>::transposed
          (Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *this)

{
  double dVar1;
  double *pdVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int j;
  int i;
  Matrix<double,_3,_3> *this_local;
  Matrix<double,_3,_3> *ret;
  
  Matrix(__return_storage_ptr__);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pdVar2 = operator()(this,local_1c,local_20);
      dVar1 = *pdVar2;
      pdVar2 = operator()(__return_storage_ptr__,local_20,local_1c);
      *pdVar2 = dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T,M,N>
Matrix<T,N,M>::transposed (void) const
{
    Matrix<T,M,N> ret;
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < M; ++j)
            ret(j,i) = (*this)(i,j);
    return ret;
}